

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroid_test.cpp
# Opt level: O0

void __thiscall
DECOMPOSE_Benchmark5times1e4_Test::~DECOMPOSE_Benchmark5times1e4_Test
          (DECOMPOSE_Benchmark5times1e4_Test *this)

{
  DECOMPOSE_Benchmark5times1e4_Test *this_local;
  
  ~DECOMPOSE_Benchmark5times1e4_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(DECOMPOSE, Benchmark5times1e4) {
	int runs = 5, size = 10000;
	rep(i, 0, runs) {
		Graph G = gen_tree(size, i);
		vector<int> degs = deg(G);
		vector<int> calcdegs = example_decompose(G);
		EXPECT_EQ(degs, calcdegs);
	}
}